

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uv-common.c
# Opt level: O3

int uv_fs_scandir_next(uv_fs_t *req,uv_dirent_t *ent)

{
  void *__ptr;
  uv__dirent_t *dent;
  uv_dirent_type_t uVar1;
  long lVar2;
  uint uVar3;
  int iVar4;
  
  lVar2 = req->result;
  if (lVar2 < 0) {
    iVar4 = (int)lVar2;
  }
  else {
    __ptr = req->ptr;
    iVar4 = -0xfff;
    if (__ptr != (void *)0x0) {
      if (req->nbufs == 0) {
        uVar3 = 0;
      }
      else {
        free(*(void **)((long)__ptr + (ulong)(req->nbufs - 1) * 8));
        uVar3 = req->nbufs;
        lVar2 = req->result;
      }
      if (uVar3 == (uint)lVar2) {
        free(__ptr);
        req->ptr = (void *)0x0;
      }
      else {
        req->nbufs = uVar3 + 1;
        dent = *(uv__dirent_t **)((long)__ptr + (ulong)uVar3 * 8);
        ent->name = dent->d_name;
        uVar1 = uv__fs_get_dirent_type(dent);
        ent->type = uVar1;
        iVar4 = 0;
      }
    }
  }
  return iVar4;
}

Assistant:

int uv_fs_scandir_next(uv_fs_t* req, uv_dirent_t* ent) {
  uv__dirent_t** dents;
  uv__dirent_t* dent;
  unsigned int* nbufs;

  /* Check to see if req passed */
  if (req->result < 0)
    return req->result;

  /* Ptr will be null if req was canceled or no files found */
  if (!req->ptr)
    return UV_EOF;

  nbufs = uv__get_nbufs(req);
  assert(nbufs);

  dents = req->ptr;

  /* Free previous entity */
  if (*nbufs > 0)
    uv__fs_scandir_free(dents[*nbufs - 1]);

  /* End was already reached */
  if (*nbufs == (unsigned int) req->result) {
    uv__fs_scandir_free(dents);
    req->ptr = NULL;
    return UV_EOF;
  }

  dent = dents[(*nbufs)++];

  ent->name = dent->d_name;
  ent->type = uv__fs_get_dirent_type(dent);

  return 0;
}